

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O1

void __thiscall
CoreML::TreeEnsembleClassifier::setOutputClassList
          (TreeEnsembleClassifier *this,vector<long,_std::allocator<long>_> *classes)

{
  RepeatedField<long> *this_00;
  uint uVar1;
  uint uVar2;
  Model *pMVar3;
  ulong uVar4;
  long lVar5;
  TreeEnsembleClassifier *pTVar6;
  Int64Vector *pIVar7;
  long *plVar8;
  Arena *pAVar9;
  ulong uVar10;
  long tmp;
  
  pMVar3 = (this->super_TreeEnsembleBase).super_Model.m_spec.
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pMVar3->_oneof_case_[0] != 0x192) {
    Specification::Model::clear_Type(pMVar3);
    pMVar3->_oneof_case_[0] = 0x192;
    uVar10 = (pMVar3->super_MessageLite)._internal_metadata_.ptr_;
    pAVar9 = (Arena *)(uVar10 & 0xfffffffffffffffc);
    if ((uVar10 & 1) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    pTVar6 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::TreeEnsembleClassifier>(pAVar9);
    (pMVar3->Type_).treeensembleclassifier_ = pTVar6;
  }
  pTVar6 = (pMVar3->Type_).treeensembleclassifier_;
  if (pTVar6->_oneof_case_[0] != 0x65) {
    Specification::TreeEnsembleClassifier::clear_ClassLabels(pTVar6);
    pTVar6->_oneof_case_[0] = 0x65;
    uVar10 = (pTVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar9 = (Arena *)(uVar10 & 0xfffffffffffffffc);
    if ((uVar10 & 1) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    pIVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>(pAVar9)
    ;
    (pTVar6->ClassLabels_).int64classlabels_ = pIVar7;
  }
  (((pTVar6->ClassLabels_).int64classlabels_)->vector_).current_size_ = 0;
  if ((classes->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (classes->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar10 = 0;
    do {
      pMVar3 = (this->super_TreeEnsembleBase).super_Model.m_spec.
               super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (pMVar3->_oneof_case_[0] != 0x192) {
        Specification::Model::clear_Type(pMVar3);
        pMVar3->_oneof_case_[0] = 0x192;
        uVar4 = (pMVar3->super_MessageLite)._internal_metadata_.ptr_;
        pAVar9 = (Arena *)(uVar4 & 0xfffffffffffffffc);
        if ((uVar4 & 1) != 0) {
          pAVar9 = *(Arena **)pAVar9;
        }
        pTVar6 = google::protobuf::Arena::
                 CreateMaybeMessage<CoreML::Specification::TreeEnsembleClassifier>(pAVar9);
        (pMVar3->Type_).treeensembleclassifier_ = pTVar6;
      }
      pTVar6 = (pMVar3->Type_).treeensembleclassifier_;
      if (pTVar6->_oneof_case_[0] != 0x65) {
        Specification::TreeEnsembleClassifier::clear_ClassLabels(pTVar6);
        pTVar6->_oneof_case_[0] = 0x65;
        uVar4 = (pTVar6->super_MessageLite)._internal_metadata_.ptr_;
        pAVar9 = (Arena *)(uVar4 & 0xfffffffffffffffc);
        if ((uVar4 & 1) != 0) {
          pAVar9 = *(Arena **)pAVar9;
        }
        pIVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                           (pAVar9);
        (pTVar6->ClassLabels_).int64classlabels_ = pIVar7;
      }
      pIVar7 = (pTVar6->ClassLabels_).int64classlabels_;
      lVar5 = (classes->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar10];
      this_00 = &pIVar7->vector_;
      uVar1 = (pIVar7->vector_).current_size_;
      uVar2 = (pIVar7->vector_).total_size_;
      if (uVar1 == uVar2) {
        google::protobuf::RepeatedField<long>::Reserve(this_00,uVar2 + 1);
      }
      plVar8 = google::protobuf::RepeatedField<long>::elements(this_00);
      plVar8[uVar1] = lVar5;
      this_00->current_size_ = uVar1 + 1;
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)(classes->super__Vector_base<long,_std::allocator<long>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(classes->super__Vector_base<long,_std::allocator<long>_>).
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void TreeEnsembleClassifier::setOutputClassList(const std::vector<int64_t>& classes) {
        m_spec->mutable_treeensembleclassifier()->mutable_int64classlabels()->clear_vector();
        for(size_t i = 0; i < classes.size(); ++i) {
            m_spec->mutable_treeensembleclassifier()->mutable_int64classlabels()->add_vector(classes[i]);
        }
    }